

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

bool __thiscall State::moveRight(State *this,State *s)

{
  int iVar1;
  State *this_00;
  int iVar2;
  
  iVar1 = (this->blank).width;
  iVar2 = this->width + -1;
  if (iVar1 != iVar2) {
    operator=(s,this);
    moveBlank(s,(Coords)0x100000000);
    this_00 = (State *)operator_new(0x28);
    State(this_00,this);
    s->previous = this_00;
  }
  return iVar1 != iVar2;
}

Assistant:

bool State::moveRight(State &s) {
    if (blank.width == width - 1) {
        return false;
    }

    s = *this;
    s.moveY(+1);
    s.previous = new State(*this);
    return true;
}